

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O2

bov_order_t * bov_order_new(GLuint *elements,GLsizei n,GLenum usage)

{
  GLsizei GVar1;
  bov_order_t *pbVar2;
  
  pbVar2 = (bov_order_t *)malloc(0xc);
  if (pbVar2 != (bov_order_t *)0x0) {
    GVar1 = 0;
    if (elements != (GLuint *)0x0) {
      GVar1 = n;
    }
    pbVar2->eboLen = GVar1;
    (*glad_glGenBuffers)(1,(GLuint *)pbVar2);
    (*glad_glBindBuffer)(0x8893,pbVar2->ebo);
    (*glad_glBufferData)(0x8893,(long)n * 4,elements,usage);
    pbVar2->eboCapacity = n;
    return pbVar2;
  }
  bov_error_log(0x30001,"Memory allocation failed");
  fprintf(_stderr,"\t(in function %s, line %d)\n","bov_order_new",0x3b6);
  exit(1);
}

Assistant:

bov_order_t* bov_order_new(const GLuint* elements, GLsizei n, GLenum usage)
{
	bov_order_t* order = malloc(sizeof(bov_order_t));
	CHECK_MALLOC(order);

	order->eboLen = elements==NULL ? 0 : n;

	glGenBuffers(1, &order->ebo);
	glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, order->ebo);
	glBufferData(GL_ELEMENT_ARRAY_BUFFER, n * sizeof(GLuint), elements, usage);
	order->eboCapacity = n;
	return order;
}